

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

int __thiscall Bitmap::init(Bitmap *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  uint8_t *__s;
  GlyphIterator *this_00;
  Orientation in_ECX;
  uint32_t in_EDX;
  GFXfont *in_R8;
  uint uVar1;
  
  if (this->glyphIterator != (GlyphIterator *)0x0) {
    operator_delete(this->glyphIterator,0x30);
  }
  if (this->data != (uint8_t *)0x0) {
    operator_delete__(this->data);
  }
  Utf8Decoder::reset(&this->utf8);
  this->width = (uint32_t)ctx;
  this->widthByte = (uint)((ulong)ctx >> 3) & 0x1fffffff;
  this->height = in_EDX;
  uVar1 = in_EDX * (uint32_t)ctx;
  this->length = uVar1;
  uVar1 = uVar1 >> 3;
  this->lengthByte = uVar1;
  this->orientation = in_ECX;
  this->font = in_R8;
  __s = (uint8_t *)operator_new__((ulong)(uVar1 + 4));
  this->data = __s;
  memset(__s,0,(ulong)uVar1);
  this_00 = (GlyphIterator *)operator_new(0x30);
  GlyphIterator::GlyphIterator(this_00);
  this->glyphIterator = this_00;
  return extraout_EAX;
}

Assistant:

void Bitmap::init(const uint32_t width, const uint32_t height, enum Orientation orientation,
               const GFXfont * const font)
{
   //cleanup old instance
   if (glyphIterator) delete glyphIterator;
   if (data) delete[] data;
   utf8.reset();

   //assert((width % 8) == 0); //width shall be a multiple of 8
   //set bitmap properties
   this->width = width;
   this->widthByte = width / 8;
   this->height = height;
   uint32_t length = width * height;
   this->length = (int32_t)length;
   this->lengthByte = length / 8;
   this->orientation = orientation;

   //set default text font
   this->font = font;

   //allocate buffer for bitmap (and clear it to zero)
   this->data = new uint8_t[this->lengthByte + 4]; //i allocate 4 extra bytes for utilized by dymon as scratchpad
   memset(this->data, 0, this->lengthByte);

   //create glyph iterator
   this->glyphIterator = new GlyphIterator();
}